

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstream.cpp
# Opt level: O0

void init_streamclass(HSQUIRRELVM v)

{
  long lVar1;
  undefined8 in_RDI;
  SQRegFunction *f;
  SQInteger i;
  long local_10;
  
  sq_pushregistrytable(in_RDI);
  sq_pushstring(in_RDI,"std_stream",0xffffffffffffffff);
  lVar1 = sq_get(in_RDI,0xfffffffffffffffe);
  if (lVar1 < 0) {
    sq_pushstring(in_RDI,"std_stream",0xffffffffffffffff);
    sq_newclass(in_RDI,0);
    sq_settypetag(in_RDI,0xffffffffffffffff,0x80000000);
    for (local_10 = 0; _stream_methods[local_10].name != (SQChar *)0x0; local_10 = local_10 + 1) {
      sq_pushstring(in_RDI,_stream_methods[local_10].name,0xffffffffffffffff);
      sq_newclosure(in_RDI,_stream_methods[local_10].f,0);
      sq_setparamscheck(in_RDI,_stream_methods[local_10].nparamscheck,
                        _stream_methods[local_10].typemask);
      sq_newslot(in_RDI,0xfffffffffffffffd,0);
    }
    sq_newslot(in_RDI,0xfffffffffffffffd,0);
    sq_pushroottable(in_RDI);
    sq_pushstring(in_RDI,"stream",0xffffffffffffffff);
    sq_pushstring(in_RDI,"std_stream",0xffffffffffffffff);
    sq_get(in_RDI,0xfffffffffffffffc);
    sq_newslot(in_RDI,0xfffffffffffffffd,0);
    sq_pop(in_RDI,1);
  }
  else {
    sq_pop(in_RDI,1);
  }
  sq_pop(in_RDI,1);
  return;
}

Assistant:

void init_streamclass(HSQUIRRELVM v)
{
    sq_pushregistrytable(v);
    sq_pushstring(v,_SC("std_stream"),-1);
    if(SQ_FAILED(sq_get(v,-2))) {
        sq_pushstring(v,_SC("std_stream"),-1);
        sq_newclass(v,SQFalse);
        sq_settypetag(v,-1,(SQUserPointer)((SQUnsignedInteger)SQSTD_STREAM_TYPE_TAG));
        SQInteger i = 0;
        while(_stream_methods[i].name != 0) {
            const SQRegFunction &f = _stream_methods[i];
            sq_pushstring(v,f.name,-1);
            sq_newclosure(v,f.f,0);
            sq_setparamscheck(v,f.nparamscheck,f.typemask);
            sq_newslot(v,-3,SQFalse);
            i++;
        }
        sq_newslot(v,-3,SQFalse);
        sq_pushroottable(v);
        sq_pushstring(v,_SC("stream"),-1);
        sq_pushstring(v,_SC("std_stream"),-1);
        sq_get(v,-4);
        sq_newslot(v,-3,SQFalse);
        sq_pop(v,1);
    }
    else {
        sq_pop(v,1); //result
    }
    sq_pop(v,1);
}